

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

bool __thiscall FTraceInfo::ThingCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  AActor *pAVar1;
  splane *psVar2;
  bool bVar3;
  ETraceStatus EVar4;
  sector_t *psVar5;
  FTraceResults *pFVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  DVector2 local_38;
  
  dVar8 = hit->Z;
  dVar10 = (((in->d).thing)->__Pos).Z;
  dVar9 = ((in->d).thing)->Height + dVar10;
  if (dVar8 <= dVar9) {
    if (dVar8 < dVar10) {
      dVar9 = (this->Vec).Z;
      if (dVar9 <= 0.0) {
        return true;
      }
      dVar8 = (this->Start).Z;
      dist = (dVar10 - dVar8) / dVar9;
      if (this->MaxDist < dist) {
        return true;
      }
      in->frac = dist / this->MaxDist;
      dVar8 = dVar8 + dVar9 * dist;
      goto LAB_004e3c60;
    }
  }
  else {
    dVar10 = (this->Vec).Z;
    if (0.0 <= dVar10) {
      return true;
    }
    dVar8 = (this->Start).Z;
    dist = (dVar9 - dVar8) / dVar10;
    if (this->MaxDist < dist) {
      return true;
    }
    in->frac = dist / this->MaxDist;
    dVar8 = dVar8 + dVar10 * dist;
LAB_004e3c60:
    hit->Z = dVar8;
    dVar10 = dist * (this->Vec).X + (this->Start).X;
    dVar9 = dist * (this->Vec).Y + (this->Start).Y;
    hit->X = dVar10;
    hit->Y = dVar9;
    pAVar1 = (in->d).thing;
    if (pAVar1->radius < ABS(dVar10 - (pAVar1->__Pos).X)) {
      return true;
    }
    if (pAVar1->radius < ABS(dVar9 - (pAVar1->__Pos).Y)) {
      return true;
    }
  }
  if ((this->CurSector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    local_38.X = hit->X;
    local_38.Y = hit->Y;
    dVar10 = secplane_t::ZatPoint(&this->CurSector->floorplane,&local_38);
    local_38.X = hit->X;
    local_38.Y = hit->Y;
    dVar9 = secplane_t::ZatPoint(&this->CurSector->ceilingplane,&local_38);
    dVar8 = hit->Z;
    if ((dVar8 <= dVar9) || (psVar5 = this->CurSector, (psVar5->planes[1].Flags & 0x1d0U) == 0x100))
    {
      if ((dVar10 <= dVar8) ||
         (psVar5 = this->CurSector, (psVar5->planes[0].Flags & 0x1d0U) == 0x100)) goto LAB_004e3e26;
      pFVar6 = this->Results;
      pFVar6->HitType = TRACE_HitFloor;
      psVar2 = psVar5->planes;
      lVar7 = 0xb0;
    }
    else {
      pFVar6 = this->Results;
      pFVar6->HitType = TRACE_HitCeiling;
      psVar2 = psVar5->planes + 1;
      lVar7 = 0xd8;
    }
    (pFVar6->HitTexture).texnum = (psVar2->Texture).texnum;
    pFVar6->Sector = sectors + psVar5->sectornum;
    bVar3 = CheckPlane(this,(secplane_t *)((long)&psVar5->planes[0].xform.xOffs + lVar7));
    if (!bVar3) {
      this->Results->HitType = TRACE_HitNone;
    }
    if (this->TraceCallback == (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) {
      return false;
    }
    EVar4 = (*this->TraceCallback)(this->Results,this->TraceCallbackData);
    switch(EVar4) {
    case TRACE_Stop:
      goto switchD_004e3e0e_caseD_0;
    case TRACE_Continue:
      return true;
    case TRACE_Skip:
      this->Results->HitType = TRACE_HitNone;
      return true;
    case TRACE_Abort:
      goto switchD_004e3e0e_caseD_3;
    default:
      dVar8 = hit->Z;
    }
  }
LAB_004e3e26:
  pFVar6 = this->Results;
  pFVar6->HitType = TRACE_HitActor;
  (pFVar6->HitPos).Z = dVar8;
  dVar10 = hit->Y;
  (pFVar6->HitPos).X = hit->X;
  (pFVar6->HitPos).Y = dVar10;
  SetSourcePosition(this);
  pFVar6 = this->Results;
  pFVar6->Distance = dist;
  pFVar6->Fraction = in->frac;
  pFVar6->Actor = (AActor *)in->d;
  if ((this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) &&
     (EVar4 = (*this->TraceCallback)(pFVar6,this->TraceCallbackData), EVar4 != TRACE_Stop)) {
    if (EVar4 == TRACE_Skip) {
      this->Results->HitType = TRACE_HitNone;
      return true;
    }
    if (EVar4 != TRACE_Abort) {
      return true;
    }
switchD_004e3e0e_caseD_3:
    this->Results->HitType = TRACE_HitNone;
  }
switchD_004e3e0e_caseD_0:
  return false;
}

Assistant:

bool FTraceInfo::ThingCheck(intercept_t *in, double dist, DVector3 hit)
{
	if (hit.Z > in->d.thing->Top())
	{
		// trace enters above actor
		if (Vec.Z >= 0) return true;      // Going up: can't hit

		// Does it hit the top of the actor?
		dist = (in->d.thing->Top() - Start.Z) / Vec.Z;

		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}
	else if (hit.Z < in->d.thing->Z())
	{ // trace enters below actor
		if (Vec.Z <= 0) return true;      // Going down: can't hit

		// Does it hit the bottom of the actor?
		dist = (in->d.thing->Z() - Start.Z) / Vec.Z;
		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}

	if (CurSector->e->XFloor.ffloors.Size())
	{
		// check for 3D floor hits first.
		double ff_floor = CurSector->floorplane.ZatPoint(hit);
		double ff_ceiling = CurSector->ceilingplane.ZatPoint(hit);

		if (hit.Z > ff_ceiling && CurSector->PortalBlocksMovement(sector_t::ceiling))	// actor is hit above the current ceiling
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
		else if (hit.Z < ff_floor && CurSector->PortalBlocksMovement(sector_t::floor))	// actor is hit below the current floor
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else goto cont1;

		// the trace hit a 3D floor before the thing.
		// Calculate an intersection and abort.
		Results->Sector = &sectors[CurSector->sectornum];
		if (!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{
			Results->HitType = TRACE_HitNone;
		}
		if (TraceCallback != NULL)
		{
			switch (TraceCallback(*Results, TraceCallbackData))
			{
			case TRACE_Continue: return true;
			case TRACE_Stop:	 return false;
			case TRACE_Abort:	 Results->HitType = TRACE_HitNone; return false;
			case TRACE_Skip:	 Results->HitType = TRACE_HitNone; return true;
			}
		}
		else
		{
			return false;
		}
	}
cont1:


	Results->HitType = TRACE_HitActor;
	Results->HitPos = hit;
	SetSourcePosition();
	Results->Distance = dist;
	Results->Fraction = in->frac;
	Results->Actor = in->d.thing;

	if (TraceCallback != NULL)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; return true;
		default:			return true;
		}
	}
	else
	{
		return false;
	}
}